

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int SetPWMJrkPololu(POLOLU *pPololu,int pw)

{
  int iVar1;
  int local_248;
  int local_244;
  int local_240;
  int local_230;
  int channel;
  int sendbuflen;
  int target;
  uchar sendbuf [512];
  int local_1c;
  int pw_local;
  POLOLU *pPololu_local;
  
  if (pPololu->bProportionalPWs[0] == 0) {
    local_1c = (int)(pPololu->CoefPWs[0] * (double)(pw + -0x5dc)) + 0x5dc;
  }
  else {
    iVar1 = (int)(pPololu->CoefPWs[0] * (double)(pw + -0x5dc));
    if (iVar1 < 0) {
      local_1c = pPololu->MidPWs[0] + (iVar1 * (pPololu->MinPWs[0] - pPololu->MidPWs[0])) / -500;
    }
    else {
      local_1c = pPololu->MidPWs[0] + (iVar1 * (pPololu->MaxPWs[0] - pPololu->MidPWs[0])) / 500;
    }
  }
  if (local_1c < pPololu->MaxPWs[0]) {
    local_240 = local_1c;
  }
  else {
    local_240 = pPololu->MaxPWs[0];
  }
  if (pPololu->MinPWs[0] < local_240) {
    if (local_1c < pPololu->MaxPWs[0]) {
      local_244 = local_1c;
    }
    else {
      local_244 = pPololu->MaxPWs[0];
    }
    local_248 = local_244;
  }
  else {
    local_248 = pPololu->MinPWs[0];
  }
  iVar1 = local_248 - pPololu->LastPWs[0];
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 < pPololu->ThresholdPWs[0]) {
    pPololu_local._4_4_ = 0;
  }
  else {
    if (pPololu->bEnableSetMultipleTargets == 0) {
      memset(&sendbuflen,0,0x200);
      iVar1 = ((local_248 + -1000) * 0xfff) / 1000;
      sendbuflen._0_1_ = ((byte)iVar1 & 0x1f) - 0x40;
      sendbuflen._1_1_ = (byte)(iVar1 >> 5) & 0x7f;
      local_230 = 2;
    }
    else {
      memset(&sendbuflen,0,0x200);
      sendbuflen._0_1_ = -0x56;
      sendbuflen._1_1_ = (byte)pPololu->DeviceNumber;
      iVar1 = ((local_248 + -1000) * 0xfff) / 1000;
      sendbuflen._2_1_ = ((byte)iVar1 & 0x1f) + 0x40;
      sendbuflen._3_1_ = (byte)(iVar1 >> 5) & 0x7f;
      local_230 = 4;
    }
    iVar1 = WriteAllRS232Port(&pPololu->RS232Port,(uint8 *)&sendbuflen,local_230);
    if (iVar1 == 0) {
      if ((pPololu->bSaveRawData != 0) && (pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(&sendbuflen,(long)local_230,1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      pPololu->LastPWs[0] = local_248;
      pPololu_local._4_4_ = 0;
    }
    else {
      pPololu_local._4_4_ = 1;
    }
  }
  return pPololu_local._4_4_;
}

Assistant:

inline int SetPWMJrkPololu(POLOLU* pPololu, int pw)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int target = 0;
	int sendbuflen = 0;
	int channel = 0; // Only 1 motor on Jrk...

	if (pPololu->bProportionalPWs[channel])
	{
		pw = (int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
		if (pw >= 0)
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
		else
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
	}
	else
	{
		pw = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
	}

	pw = max(min(pw, pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// bEnableSetMultipleTargets is used here to choose between Pololu protocol and compact protocol modes...
	if (pPololu->bEnableSetMultipleTargets)
	{
		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
		target = (pw-DEFAULT_MIN_PW_POLOLU)*4095/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU);
		sendbuf[2] = (unsigned char)(0x40 + (target & 0x1F)); // Command byte holds the lower 5 bits of target.
		sendbuf[3] = (unsigned char)((target >> 5) & 0x7F); // Data byte holds the upper 7 bits of target.
		sendbuflen = 4;
	}
	else
	{
		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		target = (pw-DEFAULT_MIN_PW_POLOLU)*4095/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU);
		sendbuf[0] = (unsigned char)(0xC0 + (target & 0x1F)); // Command byte holds the lower 5 bits of target.
		sendbuf[1] = (unsigned char)((target >> 5) & 0x7F); // Data byte holds the upper 7 bits of target.
		sendbuflen = 2;
	}

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Update last known value.
	pPololu->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}